

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

_Bool ssh_ecdhkex_w_getkey(ecdh_key *dh,ptrlen remoteKey,BinarySink *bs)

{
  uint uVar1;
  mp_int *in_RAX;
  WeierstrassPoint *wp;
  WeierstrassPoint *wp_00;
  mp_int *x;
  mp_int *local_28;
  
  local_28 = in_RAX;
  wp = ecdsa_decode(remoteKey,(ec_curve *)dh[-3].vt);
  if (wp != (WeierstrassPoint *)0x0) {
    uVar1 = ecc_weierstrass_is_identity(wp);
    if (uVar1 == 0) {
      wp_00 = ecc_weierstrass_multiply(wp,(mp_int *)dh[-2].vt);
      ecc_weierstrass_get_affine(wp_00,&local_28,(mp_int **)0x0);
      BinarySink_put_mp_ssh2(bs->binarysink_,local_28);
      mp_free(local_28);
      ecc_weierstrass_point_free(wp);
      ecc_weierstrass_point_free(wp_00);
      return true;
    }
    ecc_weierstrass_point_free(wp);
  }
  return false;
}

Assistant:

static bool ssh_ecdhkex_w_getkey(ecdh_key *dh, ptrlen remoteKey,
                                 BinarySink *bs)
{
    ecdh_key_w *dhw = container_of(dh, ecdh_key_w, ek);

    WeierstrassPoint *remote_p = ecdsa_decode(remoteKey, dhw->curve);
    if (!remote_p)
        return false;

    if (ecc_weierstrass_is_identity(remote_p)) {
        /* Not a sensible Diffie-Hellman input value */
        ecc_weierstrass_point_free(remote_p);
        return false;
    }

    WeierstrassPoint *p = ecc_weierstrass_multiply(remote_p, dhw->private);

    mp_int *x;
    ecc_weierstrass_get_affine(p, &x, NULL);
    put_mp_ssh2(bs, x);
    mp_free(x);

    ecc_weierstrass_point_free(remote_p);
    ecc_weierstrass_point_free(p);

    return true;
}